

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall cbtCollisionWorld::updateAabbs(cbtCollisionWorld *this)

{
  int iVar1;
  cbtCollisionObject *colObj;
  long lVar2;
  CProfileSample __profile;
  CProfileSample local_11;
  
  CProfileSample::CProfileSample(&local_11,"updateAabbs");
  if (0 < (this->m_collisionObjects).m_size) {
    lVar2 = 0;
    do {
      colObj = (this->m_collisionObjects).m_data[lVar2];
      if ((this->m_forceUpdateAllAabbs != false) ||
         ((iVar1 = colObj->m_activationState1, iVar1 != 2 && (iVar1 != 5)))) {
        updateSingleAabb(this,colObj);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->m_collisionObjects).m_size);
  }
  CProfileSample::~CProfileSample(&local_11);
  return;
}

Assistant:

void cbtCollisionWorld::updateAabbs()
{
	BT_PROFILE("updateAabbs");

	cbtTransform predictedTrans;
	for (int i = 0; i < m_collisionObjects.size(); i++)
	{
		cbtCollisionObject* colObj = m_collisionObjects[i];
		cbtAssert(colObj->getWorldArrayIndex() == i);

		//only update aabb of active objects
		if (m_forceUpdateAllAabbs || colObj->isActive())
		{
			updateSingleAabb(colObj);
		}
	}
}